

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopTextWrapPos(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  float fVar4;
  
  pIVar2 = GetCurrentWindow();
  ImVector<float>::pop_back
            ((ImVector<float> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  bVar1 = ImVector<float>::empty(&(pIVar2->DC).TextWrapPosStack);
  if (bVar1) {
    fVar4 = -1.0;
  }
  else {
    pfVar3 = ImVector<float>::back
                       ((ImVector<float> *)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    fVar4 = *pfVar3;
  }
  (pIVar2->DC).TextWrapPos = fVar4;
  return;
}

Assistant:

void ImGui::PopTextWrapPos()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.TextWrapPosStack.pop_back();
    window->DC.TextWrapPos = window->DC.TextWrapPosStack.empty() ? -1.0f : window->DC.TextWrapPosStack.back();
}